

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void __thiscall Rml::DataParser::~DataParser(DataParser *this)

{
  DataParser *this_local;
  
  ::std::
  vector<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
  ::~vector(&this->variable_addresses);
  ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::~vector
            (&this->program);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

DataParser(String expression, DataExpressionInterface expression_interface) :
		expression(std::move(expression)), expression_interface(expression_interface)
	{}